

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall xemmai::t_emit::f_emit_safe_point(t_emit *this,t_node *a_node)

{
  void *local_20;
  
  if (this->v_safe_points !=
      (map<std::pair<unsigned_long,_void_**>,_unsigned_long,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
       *)0x0) {
    local_20 = (void *)((long)(this->v_code->v_instructions).
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(this->v_code->v_instructions).
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3);
    std::
    vector<std::tuple<unsigned_long,unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_long>>>
    ::emplace_back<unsigned_long_const&,unsigned_long,unsigned_long_const&>
              ((vector<std::tuple<unsigned_long,unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_long>>>
                *)this->v_safe_positions,&(a_node->v_at).v_line,(unsigned_long *)&local_20,
               &(a_node->v_at).v_column);
    local_20 = t_code::v_labels[0x3d3];
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&this->v_code->v_instructions,&local_20);
    f_at(this,a_node);
  }
  return;
}

Assistant:

void f_emit_safe_point(ast::t_node* a_node)
	{
		if (!v_safe_points) return;
		v_safe_positions->emplace_back(a_node->v_at.v_line, f_last(), a_node->v_at.v_column);
		*this << c_instruction__SAFE_POINT;
		f_at(a_node);
	}